

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence_heat_maps.h
# Opt level: O1

void __thiscall
Gudhi::Persistence_representations::
Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>::
print_to_file(Persistence_heat_maps<Gudhi::Persistence_representations::squared_distance_from_diagonal_scaling>
              *this,char *filename)

{
  pointer pvVar1;
  ostream *poVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  ofstream out;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)filename);
  poVar2 = std::ostream::_M_insert<double>(this->min_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<double>(this->max_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if ((this->heat_map).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->heat_map).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    do {
      pvVar1 = (this->heat_map).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar3 = pvVar1[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar1[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8) != pdVar3) {
        lVar5 = 0;
        do {
          poVar2 = std::ostream::_M_insert<double>(pdVar3[lVar5]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
          lVar5 = lVar5 + 1;
          pvVar1 = (this->heat_map).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pdVar3 = pvVar1[lVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        } while (lVar5 != (long)*(pointer *)
                                 ((long)&pvVar1[lVar4].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data + 8) - (long)pdVar3 >> 3);
      }
      std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + (char)&local_230);
      std::ostream::put((char)&local_230);
      std::ostream::flush();
      lVar4 = lVar4 + 1;
    } while (lVar4 != ((long)(this->heat_map).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->heat_map).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Persistence_heat_maps<Scalling_of_kernels>::print_to_file(const char* filename) const {
  std::ofstream out;
  out.open(filename);

  // First we store this->min_ and this->max_ values:
  out << this->min_ << " " << this->max_ << std::endl;
  for (size_t i = 0; i != this->heat_map.size(); ++i) {
    for (size_t j = 0; j != this->heat_map[i].size(); ++j) {
      out << this->heat_map[i][j] << " ";
    }
    out << std::endl;
  }
  out.close();
}